

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.hpp
# Opt level: O1

string * Kandinsky::VariableExpression::generateName_abi_cxx11_(void)

{
  uint __val;
  long lVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  string *in_RDI;
  uint uVar8;
  uint __len;
  string __str;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __val = -generateName::count;
  if (0 < generateName::count) {
    __val = generateName::count;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar8 = 4;
    do {
      __len = uVar8;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_00105767;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_00105767;
      }
      if (uVar4 < 10000) goto LAB_00105767;
      uVar7 = uVar7 / 10000;
      uVar8 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_00105767:
  uVar8 = (uint)generateName::count >> 0x1f;
  iVar2 = generateName::count >> 0x1f;
  generateName::count = generateName::count + 1;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)iVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + uVar8,__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x107011);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar1 = plVar3[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar3;
    (in_RDI->field_2)._M_allocated_capacity = *psVar6;
  }
  in_RDI->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return in_RDI;
}

Assistant:

static std::string generateName()
        {
            static int count(0);
            return "x_{" + std::to_string(count++) + "}";
        }